

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_global.c
# Opt level: O0

TA_RetCode TA_RestoreCandleDefaultSettings(TA_CandleSettingType settingType)

{
  TA_CandleSetting *pTVar1;
  long lVar2;
  ulong uVar3;
  uint in_EDI;
  int i;
  TA_CandleSetting TA_CandleDefaultSettings [11];
  int local_11c;
  double local_118 [34];
  uint local_8;
  TA_RetCode local_4;
  
  local_8 = in_EDI;
  memcpy(local_118,&DAT_0029e9a0,0x108);
  if (local_8 < 0xc) {
    if (local_8 == 0xb) {
      for (local_11c = 0; local_11c < 0xb; local_11c = local_11c + 1) {
        pTVar1 = TA_Globals->candleSettings + local_11c;
        lVar2 = (long)local_11c;
        *(double *)pTVar1 = local_118[lVar2 * 3];
        *(double *)&pTVar1->avgPeriod = local_118[lVar2 * 3 + 1];
        pTVar1->factor = local_118[lVar2 * 3 + 2];
      }
    }
    else {
      pTVar1 = TA_Globals->candleSettings + local_8;
      uVar3 = (ulong)local_8;
      *(double *)pTVar1 = local_118[uVar3 * 3];
      *(double *)&pTVar1->avgPeriod = local_118[uVar3 * 3 + 1];
      pTVar1->factor = local_118[uVar3 * 3 + 2];
    }
    local_4 = TA_SUCCESS;
  }
  else {
    local_4 = TA_BAD_PARAM;
  }
  return local_4;
}

Assistant:

TA_RetCode TA_RestoreCandleDefaultSettings( TA_CandleSettingType settingType )
{
    const TA_CandleSetting TA_CandleDefaultSettings[] = {
        /* real body is long when it's longer than the average of the 10 previous candles' real body */
        { TA_BodyLong, TA_RangeType_RealBody, 10, 1.0 },
        /* real body is very long when it's longer than 3 times the average of the 10 previous candles' real body */
        { TA_BodyVeryLong, TA_RangeType_RealBody, 10, 3.0 },
        /* real body is short when it's shorter than the average of the 10 previous candles' real bodies */
        { TA_BodyShort, TA_RangeType_RealBody, 10, 1.0 },
        /* real body is like doji's body when it's shorter than 10% the average of the 10 previous candles' high-low range */
        { TA_BodyDoji, TA_RangeType_HighLow, 10, 0.1 },
        /* shadow is long when it's longer than the real body */
        { TA_ShadowLong, TA_RangeType_RealBody, 0, 1.0 },
        /* shadow is very long when it's longer than 2 times the real body */
        { TA_ShadowVeryLong, TA_RangeType_RealBody, 0, 2.0 },
        /* shadow is short when it's shorter than half the average of the 10 previous candles' sum of shadows */
        { TA_ShadowShort, TA_RangeType_Shadows, 10, 1.0 },
        /* shadow is very short when it's shorter than 10% the average of the 10 previous candles' high-low range */
        { TA_ShadowVeryShort, TA_RangeType_HighLow, 10, 0.1 },
        /* when measuring distance between parts of candles or width of gaps */
        /* "near" means "<= 20% of the average of the 5 previous candles' high-low range" */
        { TA_Near, TA_RangeType_HighLow, 5, 0.2 },
        /* when measuring distance between parts of candles or width of gaps */
        /* "far" means ">= 60% of the average of the 5 previous candles' high-low range" */
        { TA_Far, TA_RangeType_HighLow, 5, 0.6 },
        /* when measuring distance between parts of candles or width of gaps */
        /* "equal" means "<= 5% of the average of the 5 previous candles' high-low range" */
        { TA_Equal, TA_RangeType_HighLow, 5, 0.05 }
    };

    int i;
    if( settingType > TA_AllCandleSettings )
        return TA_BAD_PARAM;
    if( settingType == TA_AllCandleSettings )
        for( i = 0; i < TA_AllCandleSettings; ++i )
            TA_Globals->candleSettings[i] = TA_CandleDefaultSettings[i];
    else
        TA_Globals->candleSettings[settingType] = TA_CandleDefaultSettings[settingType];
    return TA_SUCCESS;
}